

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O1

char * preprocessor_sourcepos(Preprocessor *_ctx,uint *pos)

{
  undefined8 *puVar1;
  
  puVar1 = *(undefined8 **)(_ctx + 0x120);
  if (puVar1 != (undefined8 *)0x0) {
    *pos = *(uint *)((long)puVar1 + 0x4c);
    return (char *)*puVar1;
  }
  *pos = 0;
  return (char *)0x0;
}

Assistant:

const char *preprocessor_sourcepos(Preprocessor *_ctx, unsigned int *pos)
{
    Context *ctx = (Context *) _ctx;
    if (ctx->include_stack == NULL)
    {
        *pos = 0;
        return NULL;
    } // if

    *pos = ctx->include_stack->line;
    return ctx->include_stack->filename;
}